

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O1

int envy_bios_parse_inputdev(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  envy_bios_inputdev_entry *peVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  
  uVar2 = (bios->inputdev).offset;
  iVar11 = 0;
  if (uVar2 != 0) {
    bVar1 = (bios->dcb).version;
    if (bVar1 < 0x30) {
      (bios->inputdev).version = bVar1;
      (bios->inputdev).hlen = '\0';
      (bios->inputdev).entriesnum = '\b';
      (bios->inputdev).rlen = '\x01';
      uVar7 = 0;
      bVar12 = true;
    }
    else {
      if ((uint)uVar2 < bios->length) {
        (bios->inputdev).version = bios->data[(uint)uVar2];
        iVar11 = 0;
      }
      else {
        (bios->inputdev).version = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar11 = -0xe;
      }
      lVar8 = (ulong)(bios->inputdev).offset + 1;
      if ((uint)lVar8 < bios->length) {
        (bios->inputdev).hlen = bios->data[lVar8];
        iVar9 = 0;
      }
      else {
        (bios->inputdev).hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar9 = -0xe;
      }
      lVar8 = (ulong)(bios->inputdev).offset + 2;
      if ((uint)lVar8 < bios->length) {
        (bios->inputdev).entriesnum = bios->data[lVar8];
        iVar3 = 0;
      }
      else {
        (bios->inputdev).entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar3 = -0xe;
      }
      lVar8 = (ulong)(bios->inputdev).offset + 3;
      if ((uint)lVar8 < bios->length) {
        (bios->inputdev).rlen = bios->data[lVar8];
        iVar4 = 0;
      }
      else {
        (bios->inputdev).rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      bVar12 = ((iVar9 == 0 && iVar11 == 0) && iVar3 == 0) && iVar4 == 0;
      uVar7 = 4;
    }
    if (bVar12) {
      envy_bios_block(bios,(uint)(bios->inputdev).offset,
                      (uint)(bios->inputdev).entriesnum * (uint)(bios->inputdev).rlen +
                      (uint)(bios->inputdev).hlen,"INPUTDEV",-1);
      uVar6 = (bios->inputdev).version - 0x20;
      if ((uVar6 < 0x21) && ((0x100010007U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
        bVar1 = (bios->inputdev).hlen;
        if (bVar1 < uVar7) {
          fprintf(_stderr,"INPUTDEV table header too short [%d < %d]\n",(ulong)bVar1,(ulong)uVar7);
        }
        else {
          if ((bios->inputdev).rlen != '\0') {
            if (uVar7 < bVar1) {
              fprintf(_stderr,"INPUTDEV table header longer than expected [%d > %d]\n",(ulong)bVar1,
                      (ulong)uVar7);
            }
            bVar1 = (bios->inputdev).rlen;
            if (1 < bVar1) {
              fprintf(_stderr,"INPUTDEV table record longer than expected [%d > %d]\n",(ulong)bVar1,
                      1);
            }
            peVar5 = (envy_bios_inputdev_entry *)calloc((ulong)(bios->inputdev).entriesnum,4);
            (bios->inputdev).entries = peVar5;
            if (peVar5 == (envy_bios_inputdev_entry *)0x0) {
              return -0xc;
            }
            if ((bios->inputdev).entriesnum != '\0') {
              uVar10 = 0;
              do {
                peVar5 = (bios->inputdev).entries;
                uVar7 = (uint)(bios->inputdev).rlen * (int)uVar10 +
                        (uint)(bios->inputdev).hlen + (uint)(bios->inputdev).offset;
                peVar5[uVar10].offset = (uint16_t)uVar7;
                uVar7 = uVar7 & 0xffff;
                if (bios->length <= uVar7) {
                  peVar5[uVar10].entry = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar7);
                  goto LAB_00256f07;
                }
                peVar5[uVar10].entry = bios->data[uVar7];
                uVar10 = uVar10 + 1;
              } while (uVar10 < (bios->inputdev).entriesnum);
            }
            (bios->inputdev).valid = '\x01';
            return 0;
          }
          envy_bios_parse_inputdev_cold_1();
        }
      }
      else {
        envy_bios_parse_inputdev_cold_2();
      }
      iVar11 = -0x16;
    }
    else {
LAB_00256f07:
      iVar11 = -0xe;
    }
  }
  return iVar11;
}

Assistant:

int envy_bios_parse_inputdev (struct envy_bios *bios) {
	struct envy_bios_inputdev *inputdev = &bios->inputdev;
	if (!inputdev->offset)
		return 0;
	int err = 0;
	int wanthlen = 4;
	int wantrlen = 1;
	if (bios->dcb.version >= 0x30) {
		err |= bios_u8(bios, inputdev->offset, &inputdev->version);
		err |= bios_u8(bios, inputdev->offset+1, &inputdev->hlen);
		err |= bios_u8(bios, inputdev->offset+2, &inputdev->entriesnum);
		err |= bios_u8(bios, inputdev->offset+3, &inputdev->rlen);
	} else {
		inputdev->version = bios->dcb.version;
		wanthlen = inputdev->hlen = 0;
		inputdev->entriesnum = 8;
		inputdev->rlen = 1;
	}
	if (err)
		return -EFAULT;
	envy_bios_block(bios, inputdev->offset, inputdev->hlen + inputdev->rlen * inputdev->entriesnum, "INPUTDEV", -1);
	switch (inputdev->version) {
		case 0x20:
		case 0x21:
		case 0x22:
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown INPUTDEV table version %d.%d\n", inputdev->version >> 4, inputdev->version & 0xf);
			return -EINVAL;
	}
	if (inputdev->hlen < wanthlen) {
		ENVY_BIOS_ERR("INPUTDEV table header too short [%d < %d]\n", inputdev->hlen, wanthlen);
		return -EINVAL;
	}
	if (inputdev->rlen < wantrlen) {
		ENVY_BIOS_ERR("INPUTDEV table record too short [%d < %d]\n", inputdev->rlen, wantrlen);
		return -EINVAL;
	}
	if (inputdev->hlen > wanthlen) {
		ENVY_BIOS_WARN("INPUTDEV table header longer than expected [%d > %d]\n", inputdev->hlen, wanthlen);
	}
	if (inputdev->rlen > wantrlen) {
		ENVY_BIOS_WARN("INPUTDEV table record longer than expected [%d > %d]\n", inputdev->rlen, wantrlen);
	}
	inputdev->entries = calloc(inputdev->entriesnum, sizeof *inputdev->entries);
	if (!inputdev->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < inputdev->entriesnum; i++) {
		struct envy_bios_inputdev_entry *entry = &inputdev->entries[i];
		entry->offset = inputdev->offset + inputdev->hlen + inputdev->rlen * i;
		err |= bios_u8(bios, entry->offset, &entry->entry);
		if (err)
			return -EFAULT;
	}
	inputdev->valid = 1;
	return 0;
}